

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

void slang::ast::ClassPropertySymbol::fromSyntax
               (Scope *scope,ClassPropertyDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::ClassPropertySymbol_*> *results)

{
  Token *this;
  undefined1 *puVar1;
  ushort uVar2;
  MemberSyntax *pMVar3;
  size_t sVar4;
  SyntaxNode *pSVar5;
  DeclaratorSyntax *decl;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  VariableLifetime VVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  ClassPropertySymbol *this_00;
  size_t sVar8;
  VariableSymbol *this_01;
  long lVar9;
  ulong uVar10;
  SourceRange sourceRange;
  ClassPropertySymbol *var;
  RandMode local_80;
  VariableLifetime local_7c;
  Visibility local_78;
  uint local_74;
  string_view local_70;
  Scope *local_60;
  MemberSyntax *local_58;
  Compilation *local_50;
  ClassPropertyDeclarationSyntax *local_48;
  SmallVectorBase<const_slang::ast::ClassPropertySymbol_*> *local_40;
  SourceLocation local_38;
  
  local_50 = scope->compilation;
  pMVar3 = (syntax->declaration).ptr;
  VVar6 = Automatic;
  local_7c = Automatic;
  local_78 = Public;
  sVar4 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  local_60 = scope;
  local_40 = results;
  if (sVar4 == 0) {
    this_01 = (VariableSymbol *)0x0;
    local_80 = None;
    local_74 = 0;
  }
  else {
    lVar9 = 0;
    local_74 = 0;
    local_80 = None;
    this_01 = (VariableSymbol *)0x0;
    do {
      uVar2 = *(ushort *)
               ((long)&((syntax->qualifiers).
                        super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr)->kind +
               lVar9);
      if (uVar2 < 0xf1) {
        if (uVar2 == 0x7d) {
          local_74 = 1;
        }
        else if (uVar2 != 0xa7) {
          this_01 = (VariableSymbol *)0x2;
        }
      }
      else {
        switch(uVar2) {
        case 0xf1:
          this_01 = (VariableSymbol *)0x1;
          break;
        case 0xf2:
        case 0xf3:
        case 0xf4:
        case 0xf5:
        case 0xf6:
        case 0xf7:
          VariableSymbol::serializeTo(this_01,(ASTSerializer *)syntax);
          sVar8 = strlen(*(char **)(toString(slang::ast::Visibility)::strings +
                                   (long)(int)this_01[1].super_ValueSymbol.super_Symbol.kind * 8));
          ASTSerializer::write((ASTSerializer *)syntax,10,"visibility",sVar8);
          lVar9 = (long)*(int *)&this_01[1].super_ValueSymbol.super_Symbol.field_0x4;
          if (lVar9 == 0) {
            return;
          }
          sVar8 = strlen(*(char **)(toString(slang::ast::RandMode)::strings + lVar9 * 8));
          ASTSerializer::write((ASTSerializer *)syntax,8,"randMode",sVar8);
          return;
        case 0xf8:
          break;
        case 0xf9:
          local_80 = Rand;
          break;
        case 0xfa:
          local_80 = RandC;
          break;
        default:
          if (uVar2 == 0x11c) {
            VVar6 = Static;
          }
        }
      }
      lVar9 = lVar9 + 0x10;
    } while (sVar4 << 4 != lVar9);
  }
  local_78 = (Visibility)this_01;
  pSVar5 = pMVar3[1].attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  if (pSVar5 != (SyntaxNode *)0x0) {
    lVar9 = 0;
    do {
      uVar2 = *(ushort *)
               ((long)&(pMVar3[1].attributes.super_SyntaxListBase.super_SyntaxNode.parent)->kind +
               lVar9);
      if (uVar2 < 0x11c) {
        if (uVar2 != 0x67) {
          local_74 = 1;
        }
      }
      else if (uVar2 == 0x11c) {
        VVar6 = Static;
      }
      lVar9 = lVar9 + 0x10;
    } while ((long)pSVar5 << 4 != lVar9);
  }
  uVar10 = *(long *)&pMVar3[2].attributes.super_SyntaxListBase.super_SyntaxNode + 1;
  if (1 < uVar10) {
    uVar10 = uVar10 >> 1;
    lVar9 = 0;
    local_7c = VVar6;
    local_58 = pMVar3;
    local_48 = syntax;
    do {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)pMVar3[2].attributes.super_SyntaxListBase._vptr_SyntaxListBase +
                           lVar9));
      decl = (DeclaratorSyntax *)*ppSVar7;
      this = &decl->name;
      local_70 = parsing::Token::valueText(this);
      local_38 = parsing::Token::location(this);
      this_00 = BumpAllocator::
                emplace<slang::ast::ClassPropertySymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime&,slang::ast::Visibility&>
                          (&local_50->super_BumpAllocator,&local_70,&local_38,&local_7c,&local_78);
      local_70._M_len = (size_t)this_00;
      this_00->randMode = local_80;
      (this_00->super_VariableSymbol).super_ValueSymbol.declaredType.typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)
           pMVar3[1].attributes.super_SyntaxListBase.childCount;
      puVar1 = &(this_00->super_VariableSymbol).super_ValueSymbol.declaredType.field_0x3f;
      *puVar1 = *puVar1 & 0x7f;
      ValueSymbol::setFromDeclarator((ValueSymbol *)this_00,decl);
      syntax_00._M_ptr =
           (local_48->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (local_48->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes((Symbol *)local_70._M_len,local_60,syntax_00);
      SmallVectorBase<slang::ast::ClassPropertySymbol_const*>::
      emplace_back<slang::ast::ClassPropertySymbol_const*const&>
                ((SmallVectorBase<slang::ast::ClassPropertySymbol_const*> *)local_40,
                 (ClassPropertySymbol **)&local_70);
      if ((local_74 & 1) != 0) {
        *(ushort *)(local_70._M_len + 0x154) = *(ushort *)(local_70._M_len + 0x154) | 1;
      }
      if (local_80 != None) {
        *(uint *)(local_70._M_len + 0x78) = *(uint *)(local_70._M_len + 0x78) | 0x200;
      }
      if ((((local_74 & 1) != 0) && (local_7c == Static)) &&
         (decl->initializer == (EqualsValueClauseSyntax *)0x0)) {
        sourceRange = parsing::Token::range(this);
        Scope::addDiag(local_60,(DiagCode)0xc20006,sourceRange);
      }
      lVar9 = lVar9 + 0x30;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  return;
}

Assistant:

void ClassPropertySymbol::fromSyntax(const Scope& scope,
                                     const ClassPropertyDeclarationSyntax& syntax,
                                     SmallVectorBase<const ClassPropertySymbol*>& results) {
    auto& comp = scope.getCompilation();
    auto& dataSyntax = syntax.declaration->as<DataDeclarationSyntax>();

    bool isConst = false;
    VariableLifetime lifetime = VariableLifetime::Automatic;
    Visibility visibility = Visibility::Public;
    RandMode randMode = RandMode::None;

    for (Token qual : syntax.qualifiers) {
        switch (qual.kind) {
            case TokenKind::ConstKeyword:
                isConst = true;
                break;
            case TokenKind::StaticKeyword:
                lifetime = VariableLifetime::Static;
                break;
            case TokenKind::LocalKeyword:
                visibility = Visibility::Local;
                break;
            case TokenKind::ProtectedKeyword:
                visibility = Visibility::Protected;
                break;
            case TokenKind::RandKeyword:
                randMode = RandMode::Rand;
                break;
            case TokenKind::RandCKeyword:
                randMode = RandMode::RandC;
                break;
            case TokenKind::PureKeyword:
            case TokenKind::VirtualKeyword:
            case TokenKind::ExternKeyword:
                // These are not allowed on properties; the parser will issue a diagnostic
                // so just ignore them here.
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    for (Token mod : dataSyntax.modifiers) {
        switch (mod.kind) {
            case TokenKind::VarKeyword:
            case TokenKind::AutomaticKeyword:
                break;
            case TokenKind::ConstKeyword:
                isConst = true;
                break;
            case TokenKind::StaticKeyword:
                lifetime = VariableLifetime::Static;
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    for (auto declarator : dataSyntax.declarators) {
        auto var = comp.emplace<ClassPropertySymbol>(declarator->name.valueText(),
                                                     declarator->name.location(), lifetime,
                                                     visibility);
        var->randMode = randMode;
        var->setDeclaredType(*dataSyntax.type);
        var->setFromDeclarator(*declarator);
        var->setAttributes(scope, syntax.attributes);
        results.push_back(var);

        if (isConst)
            var->flags |= VariableFlags::Const;

        if (randMode != RandMode::None)
            var->getDeclaredType()->addFlags(DeclaredTypeFlags::Rand);

        if (isConst && lifetime == VariableLifetime::Static && !declarator->initializer)
            scope.addDiag(diag::StaticConstNoInitializer, declarator->name.range());
    }
}